

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O0

pool_ref<soul::AST::UsingDeclaration> __thiscall
soul::RewritingASTVisitor::visitAs<soul::AST::UsingDeclaration>
          (RewritingASTVisitor *this,pool_ref<soul::AST::UsingDeclaration> *o)

{
  bool condition;
  UsingDeclaration *pUVar1;
  pool_ref<soul::AST::UsingDeclaration> *in_RDX;
  Expression *result;
  pool_ref<soul::AST::UsingDeclaration> *o_local;
  RewritingASTVisitor *this_local;
  
  pUVar1 = pool_ref<soul::AST::UsingDeclaration>::getReference(in_RDX);
  pUVar1 = (UsingDeclaration *)visitObject((RewritingASTVisitor *)o,(Expression *)pUVar1);
  condition = is_type<soul::AST::UsingDeclaration,soul::AST::Expression>((Expression *)pUVar1);
  checkAssertion(condition,"is_type<Type> (result)","visitAs",0x1d5);
  pool_ref<soul::AST::UsingDeclaration>::pool_ref<soul::AST::UsingDeclaration,void>
            ((pool_ref<soul::AST::UsingDeclaration> *)this,pUVar1);
  return (pool_ref<soul::AST::UsingDeclaration>)(UsingDeclaration *)this;
}

Assistant:

pool_ref<Type> visitAs (pool_ref<Type> o)
    {
        auto& result = visitObject (o.getReference());
        SOUL_ASSERT (is_type<Type> (result));
        return static_cast<Type&> (result);
    }